

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void analyze_C_vars(C_Decl_Analysis *analysis,C_VarScope *vc)

{
  Ravi_CompilerInterface *pRVar1;
  Ravi_CompilerInterface *api;
  C_VarScope *vc_local;
  C_Decl_Analysis *analysis_local;
  
  pRVar1 = analysis->api;
  if (vc->var == (C_Obj *)0x0) {
    if (vc->type_def != (C_Type *)0x0) {
      analyze_C_types(analysis,vc->type_def);
    }
  }
  else {
    (*pRVar1->error_message)(pRVar1->context,"Declaring objects is not allowed: ");
    (*pRVar1->error_message)(pRVar1->context,vc->var->name);
    analysis->status = analysis->status + -1;
  }
  return;
}

Assistant:

static void analyze_C_vars(C_Decl_Analysis *analysis, C_VarScope *vc)
{
	struct Ravi_CompilerInterface *api = analysis->api;
	if (vc->var) {
		api->error_message(api->context, "Declaring objects is not allowed: ");
		api->error_message(api->context, vc->var->name); // FIXME error formatting
		analysis->status--;
	} else if (vc->type_def) {
		analyze_C_types(analysis, vc->type_def);
	}
}